

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

void __thiscall
Centaurus::CharClass<wchar_t>::CharClass
          (CharClass<wchar_t> *this,initializer_list<wchar_t> *ch_list)

{
  size_type sVar1;
  iterator pwVar2;
  long lVar3;
  Range<wchar_t> local_40;
  
  this->_vptr_CharClass = (_func_int **)&PTR__CharClass_001b44e0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = ch_list->_M_len;
  pwVar2 = ch_list->_M_array;
  for (lVar3 = 0; sVar1 << 2 != lVar3; lVar3 = lVar3 + 4) {
    local_40.m_start = *(wchar_t *)((long)pwVar2 + lVar3);
    local_40._vptr_Range = (_func_int **)&PTR__Range_001b4590;
    local_40.m_end = local_40.m_start + L'\x01';
    std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
    emplace_back<Centaurus::Range<wchar_t>>
              ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)
               &this->m_ranges,&local_40);
  }
  return;
}

Assistant:

CharClass(const std::initializer_list<wchar_t>& ch_list)
    {
        for (wchar_t ch : ch_list)
        {
            m_ranges.push_back(Range<TCHAR>(ch, ch + 1));
        }
    }